

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscSat.c
# Opt level: O1

void Ssc_ManCnfNodeAddToSolver(Ssc_Man_t *p,int NodeId)

{
  Gia_Obj_t *pGVar1;
  lit *plVar2;
  Gia_Obj_t *pGVar3;
  int *piVar4;
  Gia_Man_t *p_00;
  int iVar5;
  long lVar6;
  Gia_Obj_t *pGVar7;
  Vec_Int_t *pVVar8;
  Gia_Obj_t *pGVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  Gia_Obj_t *pGVar13;
  uint uVar14;
  uint uVar15;
  timespec ts;
  Gia_Obj_t *pNodeE;
  Gia_Obj_t *pNodeT;
  timespec local_78;
  ulong local_68;
  uint local_5c;
  uint local_58;
  uint local_54;
  long local_50;
  long local_48;
  Gia_Obj_t *local_40;
  Gia_Obj_t *local_38;
  
  if (NodeId < 1) {
    __assert_fail("NodeId > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscSat.c"
                  ,0xd5,"void Ssc_ManCnfNodeAddToSolver(Ssc_Man_t *, int)");
  }
  if (p->vId2Var->nSize <= NodeId) {
LAB_006393ec:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  if (p->vId2Var->pArray[(uint)NodeId] == 0) {
    iVar5 = clock_gettime(3,&local_78);
    if (iVar5 < 0) {
      local_50 = 1;
    }
    else {
      lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) *
                      SEXT816(CONCAT44(local_78.tv_nsec._4_4_,(uint)local_78.tv_nsec)),8);
      local_50 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) +
                 CONCAT44(local_78.tv_sec._4_4_,(uint)local_78.tv_sec) * -1000000;
    }
    pVVar8 = p->vFront;
    pVVar8->nSize = 0;
    Ssc_ManCnfAddToFrontier(p,NodeId,pVVar8);
    pVVar8 = p->vFront;
    if (0 < pVVar8->nSize) {
      lVar10 = 0;
      do {
        iVar5 = pVVar8->pArray[lVar10];
        lVar6 = (long)iVar5;
        if ((lVar6 < 0) || (p->pFraig->nObjs <= iVar5)) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        pGVar13 = p->pFraig->pObjs;
        if (pGVar13 == (Gia_Obj_t *)0x0) break;
        if (p->vId2Var->nSize <= iVar5) goto LAB_006393ec;
        if (p->vId2Var->pArray[lVar6] == 0) {
          __assert_fail("Ssc_ObjSatVar(p, Gia_ObjId(p->pFraig, pNode))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscSat.c"
                        ,0xe1,"void Ssc_ManCnfNodeAddToSolver(Ssc_Man_t *, int)");
        }
        pGVar13 = pGVar13 + lVar6;
        iVar5 = Gia_ObjIsMuxType(pGVar13);
        if (iVar5 == 0) {
          if (((ulong)pGVar13 & 1) != 0) {
            __assert_fail("!Gia_IsComplement(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscSat.c"
                          ,0xb2,"void Ssc_ManCollectSuper(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
          }
          if (((int)(uint)*(undefined8 *)pGVar13 < 0) ||
             (((uint)*(undefined8 *)pGVar13 & 0x1fffffff) == 0x1fffffff)) {
            __assert_fail("Gia_ObjIsAnd(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscSat.c"
                          ,0xb3,"void Ssc_ManCollectSuper(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
          }
          p_00 = p->pFraig;
          pVVar8 = p->vFanins;
          pVVar8->nSize = 0;
          Ssc_ManCollectSuper_rec
                    (p_00,(Gia_Obj_t *)
                          ((ulong)((uint)(*(ulong *)pGVar13 >> 0x1d) & 1) |
                          (ulong)(pGVar13 + -(*(ulong *)pGVar13 & 0x1fffffff))),pVVar8);
          Ssc_ManCollectSuper_rec
                    (p_00,(Gia_Obj_t *)
                          ((ulong)((uint)(*(ulong *)pGVar13 >> 0x3d) & 1) |
                          (ulong)(pGVar13 + -(*(ulong *)pGVar13 >> 0x20 & 0x1fffffff))),pVVar8);
          pVVar8 = p->vFanins;
          if (0 < pVVar8->nSize) {
            lVar6 = 0;
            do {
              if (pVVar8->pArray[lVar6] < 0) goto LAB_006393ae;
              Ssc_ManCnfAddToFrontier(p,(uint)pVVar8->pArray[lVar6] >> 1,p->vFront);
              lVar6 = lVar6 + 1;
              pVVar8 = p->vFanins;
            } while (lVar6 < pVVar8->nSize);
          }
          if (((int)(uint)*(undefined8 *)pGVar13 < 0) ||
             (((uint)*(undefined8 *)pGVar13 & 0x1fffffff) == 0x1fffffff)) {
            __assert_fail("Gia_ObjIsAnd( pNode )",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscSat.c"
                          ,0x84,"void Gia_ManAddClausesSuper(Ssc_Man_t *, Gia_Obj_t *, Vec_Int_t *)"
                         );
          }
          pGVar3 = p->pFraig->pObjs;
          if ((pGVar13 < pGVar3) || (pGVar3 + p->pFraig->nObjs <= pGVar13)) goto LAB_0063940b;
          uVar11 = (int)((long)pGVar13 - (long)pGVar3 >> 2) * -0x55555555;
          if ((int)uVar11 < 0) {
LAB_006393cd:
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x12e,"int Abc_Var2Lit(int, int)");
          }
          if (p->vId2Var->nSize <= (int)uVar11) goto LAB_006393ec;
          iVar5 = p->vId2Var->pArray[uVar11 & 0x7fffffff];
          if (iVar5 < 0) goto LAB_006393cd;
          uVar11 = iVar5 * 2;
          if (0 < pVVar8->nSize) {
            lVar6 = 0;
            do {
              uVar12 = pVVar8->pArray[lVar6];
              if ((int)uVar12 < 0) {
LAB_006393ae:
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                              ,0x12f,"int Abc_Lit2Var(int)");
              }
              if (p->vId2Var->nSize <= (int)(uVar12 >> 1)) goto LAB_006393ec;
              iVar5 = p->vId2Var->pArray[uVar12 >> 1];
              if (iVar5 < 0) goto LAB_006393cd;
              local_78.tv_sec._0_4_ = (uVar12 & 1) + iVar5 * 2;
              local_78.tv_sec._4_4_ = uVar11 | 1;
              iVar5 = sat_solver_addclause(p->pSat,(lit *)&local_78,(lit *)&local_78.tv_nsec);
              if (iVar5 == 0) {
                __assert_fail("RetValue",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscSat.c"
                              ,0x8e,
                              "void Gia_ManAddClausesSuper(Ssc_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
              }
              if ((int)(uint)local_78.tv_sec < 0) {
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                              ,0x131,"int Abc_LitNot(int)");
              }
              if (pVVar8->nSize <= lVar6) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                              ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
              }
              pVVar8->pArray[lVar6] = (uint)local_78.tv_sec ^ 1;
              lVar6 = lVar6 + 1;
            } while (lVar6 < pVVar8->nSize);
          }
          Vec_IntPush(pVVar8,uVar11);
          iVar5 = sat_solver_addclause(p->pSat,pVVar8->pArray,pVVar8->pArray + pVVar8->nSize);
          if (iVar5 == 0) {
            __assert_fail("RetValue",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscSat.c"
                          ,0x95,"void Gia_ManAddClausesSuper(Ssc_Man_t *, Gia_Obj_t *, Vec_Int_t *)"
                         );
          }
        }
        else {
          pVVar8 = p->vFanins;
          pVVar8->nSize = 0;
          pGVar7 = pGVar13 + -(ulong)((uint)*(undefined8 *)pGVar13 & 0x1fffffff);
          pGVar3 = p->pFraig->pObjs;
          if ((pGVar7 < pGVar3) || (pGVar3 + p->pFraig->nObjs <= pGVar7)) {
LAB_0063940b:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          Vec_IntPush(pVVar8,(int)((ulong)((long)pGVar7 - (long)pGVar3) >> 2) * -0x55555555 -
                             (*(uint *)pGVar7 & 0x1fffffff));
          pGVar7 = pGVar13 + -(ulong)(*(uint *)&pGVar13->field_0x4 & 0x1fffffff);
          pGVar3 = p->pFraig->pObjs;
          if ((pGVar7 < pGVar3) || (pGVar3 + p->pFraig->nObjs <= pGVar7)) goto LAB_0063940b;
          pVVar8 = p->vFanins;
          iVar5 = (int)((ulong)((long)pGVar7 - (long)pGVar3) >> 2) * -0x55555555 -
                  (*(uint *)pGVar7 & 0x1fffffff);
          if (0 < (long)pVVar8->nSize) {
            lVar6 = 0;
            do {
              if (pVVar8->pArray[lVar6] == iVar5) goto LAB_00638cfc;
              lVar6 = lVar6 + 1;
            } while (pVVar8->nSize != lVar6);
          }
          Vec_IntPush(pVVar8,iVar5);
LAB_00638cfc:
          pGVar7 = pGVar13 + -(ulong)((uint)*(undefined8 *)pGVar13 & 0x1fffffff);
          pGVar3 = p->pFraig->pObjs;
          if ((pGVar7 < pGVar3) || (pGVar3 + p->pFraig->nObjs <= pGVar7)) goto LAB_0063940b;
          pVVar8 = p->vFanins;
          iVar5 = (int)((ulong)((long)pGVar7 - (long)pGVar3) >> 2) * -0x55555555 -
                  (*(uint *)&pGVar7->field_0x4 & 0x1fffffff);
          if (0 < (long)pVVar8->nSize) {
            lVar6 = 0;
            do {
              if (pVVar8->pArray[lVar6] == iVar5) goto LAB_00638d7a;
              lVar6 = lVar6 + 1;
            } while (pVVar8->nSize != lVar6);
          }
          Vec_IntPush(pVVar8,iVar5);
LAB_00638d7a:
          pGVar7 = pGVar13 + -(ulong)(*(uint *)&pGVar13->field_0x4 & 0x1fffffff);
          pGVar3 = p->pFraig->pObjs;
          if ((pGVar7 < pGVar3) || (pGVar3 + p->pFraig->nObjs <= pGVar7)) goto LAB_0063940b;
          pVVar8 = p->vFanins;
          iVar5 = (int)((ulong)((long)pGVar7 - (long)pGVar3) >> 2) * -0x55555555 -
                  (*(uint *)&pGVar7->field_0x4 & 0x1fffffff);
          if (0 < (long)pVVar8->nSize) {
            lVar6 = 0;
            do {
              if (pVVar8->pArray[lVar6] == iVar5) goto LAB_00638df7;
              lVar6 = lVar6 + 1;
            } while (pVVar8->nSize != lVar6);
          }
          Vec_IntPush(pVVar8,iVar5);
LAB_00638df7:
          pVVar8 = p->vFanins;
          if (0 < pVVar8->nSize) {
            lVar6 = 0;
            do {
              Ssc_ManCnfAddToFrontier(p,pVVar8->pArray[lVar6],p->vFront);
              lVar6 = lVar6 + 1;
              pVVar8 = p->vFanins;
            } while (lVar6 < pVVar8->nSize);
          }
          if (((ulong)pGVar13 & 1) != 0) {
            __assert_fail("!Gia_IsComplement( pNode )",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscSat.c"
                          ,0x35,"void Gia_ManAddClausesMux(Ssc_Man_t *, Gia_Obj_t *)");
          }
          iVar5 = Gia_ObjIsMuxType(pGVar13);
          if (iVar5 == 0) {
            __assert_fail("Gia_ObjIsMuxType( pNode )",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscSat.c"
                          ,0x36,"void Gia_ManAddClausesMux(Ssc_Man_t *, Gia_Obj_t *)");
          }
          pGVar9 = Gia_ObjRecognizeMux(pGVar13,&local_38,&local_40);
          pGVar7 = local_40;
          pGVar3 = p->pFraig->pObjs;
          if ((pGVar13 < pGVar3) || (pGVar1 = pGVar3 + p->pFraig->nObjs, pGVar1 <= pGVar13))
          goto LAB_0063940b;
          uVar11 = (int)((long)pGVar13 - (long)pGVar3 >> 2) * -0x55555555;
          if ((int)uVar11 < 0) goto LAB_006393cd;
          iVar5 = p->vId2Var->nSize;
          if (iVar5 <= (int)uVar11) goto LAB_006393ec;
          piVar4 = p->vId2Var->pArray;
          if (piVar4[uVar11 & 0x7fffffff] < 0) goto LAB_006393cd;
          pGVar13 = (Gia_Obj_t *)((ulong)pGVar9 & 0xfffffffffffffffe);
          if ((pGVar13 < pGVar3) || (pGVar1 <= pGVar13)) goto LAB_0063940b;
          uVar12 = (int)((long)pGVar13 - (long)pGVar3 >> 2) * -0x55555555;
          if ((int)uVar12 < 0) goto LAB_006393cd;
          if (iVar5 <= (int)uVar12) goto LAB_006393ec;
          if (piVar4[uVar12 & 0x7fffffff] < 0) goto LAB_006393cd;
          pGVar13 = (Gia_Obj_t *)((ulong)local_38 & 0xfffffffffffffffe);
          if ((pGVar13 < pGVar3) || (pGVar1 <= pGVar13)) goto LAB_0063940b;
          uVar14 = (int)((long)pGVar13 - (long)pGVar3 >> 2) * -0x55555555;
          if ((int)uVar14 < 0) goto LAB_006393cd;
          if (iVar5 <= (int)uVar14) goto LAB_006393ec;
          if (piVar4[uVar14 & 0x7fffffff] < 0) goto LAB_006393cd;
          pGVar13 = (Gia_Obj_t *)((ulong)local_40 & 0xfffffffffffffffe);
          if ((pGVar13 < pGVar3) || (pGVar1 <= pGVar13)) goto LAB_0063940b;
          uVar15 = (int)((long)pGVar13 - (long)pGVar3 >> 2) * -0x55555555;
          if ((int)uVar15 < 0) goto LAB_006393cd;
          if (iVar5 <= (int)uVar15) goto LAB_006393ec;
          plVar2 = (lit *)((long)&local_78.tv_nsec + 4);
          local_68 = (ulong)(uint)piVar4[uVar15 & 0x7fffffff];
          local_48 = lVar10;
          if (piVar4[uVar15 & 0x7fffffff] < 0) goto LAB_006393cd;
          uVar15 = piVar4[uVar11 & 0x7fffffff] * 2;
          local_54 = ((uint)pGVar9 & 1) + piVar4[uVar12 & 0x7fffffff] * 2;
          uVar11 = ((uint)local_38 & 1) + piVar4[uVar14 & 0x7fffffff] * 2;
          uVar12 = local_54 ^ 1;
          local_78.tv_sec._4_4_ = uVar11 ^ 1;
          local_78.tv_sec._0_4_ = uVar12;
          local_78.tv_nsec._0_4_ = uVar15;
          local_5c = local_78.tv_sec._4_4_;
          iVar5 = sat_solver_addclause(p->pSat,(lit *)&local_78,plVar2);
          if (iVar5 == 0) {
            __assert_fail("RetValue",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscSat.c"
                          ,0x4b,"void Gia_ManAddClausesMux(Ssc_Man_t *, Gia_Obj_t *)");
          }
          uVar14 = uVar15 | 1;
          local_78.tv_sec._0_4_ = uVar12;
          local_78.tv_sec._4_4_ = uVar11;
          local_78.tv_nsec._0_4_ = uVar14;
          local_58 = uVar11;
          iVar5 = sat_solver_addclause(p->pSat,(lit *)&local_78,plVar2);
          uVar11 = local_54;
          if (iVar5 == 0) {
            __assert_fail("RetValue",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscSat.c"
                          ,0x50,"void Gia_ManAddClausesMux(Ssc_Man_t *, Gia_Obj_t *)");
          }
          uVar12 = ((uint)pGVar7 & 1) + (int)local_68 * 2;
          local_78.tv_sec._0_4_ = local_54;
          local_68 = CONCAT44(local_68._4_4_,uVar15);
          local_78.tv_sec._4_4_ = uVar12 ^ 1;
          local_78.tv_nsec._0_4_ = uVar15;
          iVar5 = sat_solver_addclause
                            (p->pSat,(lit *)&local_78,(lit *)((long)&local_78.tv_nsec + 4));
          if (iVar5 == 0) {
            __assert_fail("RetValue",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscSat.c"
                          ,0x55,"void Gia_ManAddClausesMux(Ssc_Man_t *, Gia_Obj_t *)");
          }
          local_78.tv_sec._0_4_ = uVar11;
          local_78.tv_sec._4_4_ = uVar12;
          local_78.tv_nsec._0_4_ = uVar14;
          iVar5 = sat_solver_addclause
                            (p->pSat,(lit *)&local_78,(lit *)((long)&local_78.tv_nsec + 4));
          if (iVar5 == 0) {
            __assert_fail("RetValue",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscSat.c"
                          ,0x5a,"void Gia_ManAddClausesMux(Ssc_Man_t *, Gia_Obj_t *)");
          }
          lVar10 = local_48;
          if (local_58 != uVar12) {
            local_78.tv_sec._0_4_ = local_58;
            plVar2 = (lit *)((long)&local_78.tv_nsec + 4);
            local_78.tv_sec._4_4_ = uVar12;
            local_78.tv_nsec._0_4_ = uVar14;
            iVar5 = sat_solver_addclause(p->pSat,(lit *)&local_78,plVar2);
            if (iVar5 == 0) {
              __assert_fail("RetValue",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscSat.c"
                            ,0x6d,"void Gia_ManAddClausesMux(Ssc_Man_t *, Gia_Obj_t *)");
            }
            local_78.tv_sec._0_4_ = local_5c;
            local_78.tv_nsec._0_4_ = (uint)local_68;
            local_78.tv_sec._4_4_ = uVar12 ^ 1;
            iVar5 = sat_solver_addclause(p->pSat,(lit *)&local_78,plVar2);
            lVar10 = local_48;
            if (iVar5 == 0) {
              __assert_fail("RetValue",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscSat.c"
                            ,0x72,"void Gia_ManAddClausesMux(Ssc_Man_t *, Gia_Obj_t *)");
            }
          }
        }
        if (p->vFanins->nSize < 2) {
          __assert_fail("Vec_IntSize(p->vFanins) > 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscSat.c"
                        ,0xf4,"void Ssc_ManCnfNodeAddToSolver(Ssc_Man_t *, int)");
        }
        lVar10 = lVar10 + 1;
        pVVar8 = p->vFront;
      } while (lVar10 < pVVar8->nSize);
    }
    iVar5 = clock_gettime(3,&local_78);
    if (iVar5 < 0) {
      lVar10 = -1;
    }
    else {
      lVar10 = CONCAT44(local_78.tv_nsec._4_4_,(uint)local_78.tv_nsec) / 1000 +
               CONCAT44(local_78.tv_sec._4_4_,(uint)local_78.tv_sec) * 1000000;
    }
    p->timeCnfGen = p->timeCnfGen + lVar10 + local_50;
  }
  return;
}

Assistant:

static void Ssc_ManCnfNodeAddToSolver( Ssc_Man_t * p, int NodeId )
{
    Gia_Obj_t * pNode;
    int i, k, Id, Lit;
    abctime clk;
    assert( NodeId > 0 );
    // quit if CNF is ready
    if ( Ssc_ObjSatVar(p, NodeId) )
        return;
clk = Abc_Clock();
    // start the frontier
    Vec_IntClear( p->vFront );
    Ssc_ManCnfAddToFrontier( p, NodeId, p->vFront );
    // explore nodes in the frontier
    Gia_ManForEachObjVec( p->vFront, p->pFraig, pNode, i )
    {
        // create the supergate
        assert( Ssc_ObjSatVar(p, Gia_ObjId(p->pFraig, pNode)) );
        if ( Gia_ObjIsMuxType(pNode) )
        {
            Vec_IntClear( p->vFanins );
            Vec_IntPushUnique( p->vFanins, Gia_ObjFaninId0p( p->pFraig, Gia_ObjFanin0(pNode) ) );
            Vec_IntPushUnique( p->vFanins, Gia_ObjFaninId0p( p->pFraig, Gia_ObjFanin1(pNode) ) );
            Vec_IntPushUnique( p->vFanins, Gia_ObjFaninId1p( p->pFraig, Gia_ObjFanin0(pNode) ) );
            Vec_IntPushUnique( p->vFanins, Gia_ObjFaninId1p( p->pFraig, Gia_ObjFanin1(pNode) ) );
            Vec_IntForEachEntry( p->vFanins, Id, k )
                Ssc_ManCnfAddToFrontier( p, Id, p->vFront );
            Gia_ManAddClausesMux( p, pNode );
        }
        else
        {
            Ssc_ManCollectSuper( p->pFraig, pNode, p->vFanins );
            Vec_IntForEachEntry( p->vFanins, Lit, k )
                Ssc_ManCnfAddToFrontier( p, Abc_Lit2Var(Lit), p->vFront );
            Gia_ManAddClausesSuper( p, pNode, p->vFanins );
        }
        assert( Vec_IntSize(p->vFanins) > 1 );
    }
p->timeCnfGen += Abc_Clock() - clk;
}